

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O3

void cjson_replace_item_in_object_should_preserve_name(void)

{
  cJSON *item;
  cJSON *replacement;
  cJSON_bool in_R8D;
  long in_FS_OFFSET;
  cJSON root [1];
  cJSON local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.valuedouble = 0.0;
  local_68.string = (char *)0x0;
  local_68.valuestring = (char *)0x0;
  local_68.valueint = 0;
  local_68._44_4_ = 0;
  local_68.child = (cJSON *)0x0;
  local_68.type = 0;
  local_68._28_4_ = 0;
  local_68.next = (cJSON *)0x0;
  local_68.prev = (cJSON *)0x0;
  item = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x150);
  }
  else {
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    item->type = 8;
    item->valuedouble = 1.0;
    item->valueint = 1;
  }
  replacement = (cJSON *)(*global_hooks.allocate)(0x40);
  if (replacement == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x152);
    add_item_to_object(&local_68,"child",item,(internal_hooks *)0x0,in_R8D);
  }
  else {
    replacement->child = (cJSON *)0x0;
    *(undefined8 *)&replacement->type = 0;
    replacement->valuedouble = 0.0;
    replacement->string = (char *)0x0;
    replacement->valuestring = (char *)0x0;
    *(undefined8 *)&replacement->valueint = 0;
    replacement->next = (cJSON *)0x0;
    replacement->prev = (cJSON *)0x0;
    replacement->type = 8;
    replacement->valuedouble = 2.0;
    replacement->valueint = 2;
    add_item_to_object(&local_68,"child",item,(internal_hooks *)0x0,in_R8D);
    replace_item_in_object(&local_68,"child",replacement,0);
  }
  if (local_68.child != replacement) {
    UnityFail(" Expected TRUE Was FALSE",0x157);
  }
  UnityAssertEqualString("child",replacement->string,(char *)0x0,0x158);
  cJSON_Delete(replacement);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_replace_item_in_object_should_preserve_name(void)
{
    cJSON root[1] = {{ NULL, NULL, NULL, 0, NULL, 0, 0, NULL }};
    cJSON *child = NULL;
    cJSON *replacement = NULL;

    child = cJSON_CreateNumber(1);
    TEST_ASSERT_NOT_NULL(child);
    replacement = cJSON_CreateNumber(2);
    TEST_ASSERT_NOT_NULL(replacement);

    cJSON_AddItemToObject(root, "child", child);
    cJSON_ReplaceItemInObject(root, "child", replacement);

    TEST_ASSERT_TRUE(root->child == replacement);
    TEST_ASSERT_EQUAL_STRING("child", replacement->string);

    cJSON_Delete(replacement);
}